

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jnt_convolve_avx2.c
# Opt level: O0

void av1_dist_wtd_convolve_2d_avx2
               (uint8_t *src,int src_stride,uint8_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params)

{
  ushort uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  __m256i data_00;
  __m256i data_01;
  __m256i data_02;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  char cVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  uint uVar82;
  int iVar83;
  int in_ECX;
  int iVar84;
  int iVar85;
  long lVar86;
  long lVar87;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  long in_stack_00000008;
  undefined4 in_stack_0000002c;
  __m128i res_1_10;
  __m128i res_0_10;
  __m256i res_8_5;
  __m256i round_result_5;
  __m256i comp_avg_res_5;
  __m256i data_ref_0_5;
  __m256i res_unsigned_5;
  __m256i res_16b_5;
  __m128i res_1_9;
  __m128i res_0_9;
  __m128i res_1_8;
  __m128i res_0_8;
  __m256i res_8_4;
  __m256i round_result_4;
  __m256i comp_avg_res_4;
  __m256i data_ref_0_4;
  __m256i res_unsigned_4;
  __m256i res_16b_4;
  __m256i res_b_round_2;
  __m256i res_b_2;
  __m256i res_a_round_2;
  __m256i res_a_2;
  __m256i s7_1;
  __m256i s6_1;
  int16_t *data_5;
  __m256i s5_2;
  __m256i s4_2;
  __m256i s3_2;
  __m256i s2_2;
  __m256i s1_2;
  __m256i s0_2;
  __m256i s_2 [8];
  __m256i res_3;
  __m256i data_4;
  uint8_t *src_h_2;
  int j_2;
  uint8_t *src_ptr_2;
  int fo_horiz_2;
  int fo_vert_2;
  int im_h_2;
  __m128i res_1_7;
  __m128i res_0_7;
  __m128i res_1_6;
  __m128i res_0_6;
  __m256i res_8_3;
  __m256i round_result_3;
  __m256i comp_avg_res_3;
  __m256i data_ref_0_3;
  __m256i res_unsigned_3;
  __m256i res_16b_3;
  __m128i res_1_5;
  __m128i res_0_5;
  __m128i res_1_4;
  __m128i res_0_4;
  __m256i res_8_2;
  __m256i round_result_2;
  __m256i comp_avg_res_2;
  __m256i data_ref_0_2;
  __m256i res_unsigned_2;
  __m256i res_16b_2;
  __m256i res_b_round_1;
  __m256i res_b_1;
  __m256i res_a_round_1;
  __m256i res_a_1;
  __m256i s5_1;
  __m256i s4_1;
  int16_t *data_3;
  __m256i s3_1;
  __m256i s2_1;
  __m256i s1_1;
  __m256i s0_1;
  __m256i s_1 [6];
  __m256i res_2;
  __m256i data_2;
  uint8_t *src_h_1;
  int j_1;
  uint8_t *src_ptr_1;
  int fo_horiz_1;
  int fo_vert_1;
  int im_h_1;
  __m128i res_1_3;
  __m128i res_0_3;
  __m128i res_1_2;
  __m128i res_0_2;
  __m256i res_8_1;
  __m256i round_result_1;
  __m256i comp_avg_res_1;
  __m256i data_ref_0_1;
  __m256i res_unsigned_1;
  __m256i res_16b_1;
  __m128i res_1_1;
  __m128i res_0_1;
  __m128i res_1;
  __m128i res_0;
  __m256i res_8;
  __m256i round_result;
  __m256i comp_avg_res;
  __m256i data_ref_0;
  __m256i res_unsigned;
  __m256i res_16b;
  __m256i res_b_round;
  __m256i res_b;
  __m256i res_a_round;
  __m256i res_a;
  __m256i s7;
  __m256i s6;
  int16_t *data_1;
  __m256i s5;
  __m256i s4;
  __m256i s3;
  __m256i s2;
  __m256i s1;
  __m256i s0;
  __m256i s [8];
  __m256i res;
  __m256i data;
  uint8_t *src_h;
  int j;
  uint8_t *src_ptr;
  int fo_horiz;
  int fo_vert;
  int im_h;
  __m256i coeffs_y [4];
  __m256i coeffs_x [4];
  __m256i filt [4];
  __m128i round_shift_v;
  __m256i round_const_v;
  __m128i round_shift_h;
  __m256i round_const_h;
  __m256i rounding_const;
  int rounding_shift;
  __m256i offset_const;
  int offset;
  int offset_0;
  int use_dist_wtd_comp_avg;
  int do_average;
  __m256i wt;
  int is_vert_4tap;
  int is_horiz_4tap;
  int i;
  int im_stride;
  int16_t im_block [1120];
  int bd;
  int dst_stride;
  CONV_BUF_TYPE *dst;
  __m256i *in_stack_ffffffffffffce78;
  undefined4 in_stack_ffffffffffffce80;
  int in_stack_ffffffffffffce84;
  InterpFilterParams *in_stack_ffffffffffffce88;
  __m256i *in_stack_ffffffffffffce90;
  undefined4 in_stack_ffffffffffffce98;
  int in_stack_ffffffffffffce9c;
  InterpFilterParams *in_stack_ffffffffffffcea0;
  ConvolveParams *in_stack_ffffffffffffcea8;
  __m256i *in_stack_ffffffffffffceb0;
  undefined8 uStack_3148;
  undefined8 local_3140;
  __m256i *in_stack_ffffffffffffcec8;
  __m256i *in_stack_ffffffffffffced0;
  undefined8 in_stack_ffffffffffffced8;
  undefined8 in_stack_ffffffffffffcee0;
  __m256i *in_stack_ffffffffffffcee8;
  __m256i *in_stack_ffffffffffffcef0;
  undefined8 local_30e0;
  __m256i *palStack_30d8;
  undefined8 uStack_30d0;
  int use_dist_wtd_comp_avg_00;
  undefined8 uVar90;
  __m256i *wt_00;
  undefined1 local_30c0 [32];
  undefined8 uStack_30a8;
  undefined8 local_3080;
  undefined8 local_3060;
  undefined8 uStack_3058;
  undefined8 uStack_3050;
  undefined8 uStack_3048;
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  undefined8 local_2fe0;
  undefined8 uStack_2fd8;
  undefined8 uStack_2fd0;
  undefined8 uStack_2fc8;
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  undefined8 local_2fa0;
  undefined8 uStack_2f98;
  undefined8 uStack_2f90;
  undefined8 uStack_2f88;
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  undefined8 local_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  undefined1 local_2d00 [16];
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined1 local_2ce0 [32];
  undefined1 (*local_2ca8) [16];
  int local_2c9c;
  undefined4 local_2c60;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined8 local_2c20;
  undefined8 uStack_2c18;
  undefined8 uStack_2c10;
  undefined8 uStack_2c08;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 local_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  undefined8 local_2b60;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 local_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 local_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined1 local_2860 [16];
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined1 local_2840 [32];
  undefined1 (*local_2808) [16];
  int local_27fc;
  undefined4 local_27c0;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26c0;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined1 local_2340 [16];
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined1 local_2320 [32];
  undefined1 (*local_22e8) [16];
  int local_22dc;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  byte local_2084;
  ushort local_2050;
  byte local_204c;
  int local_2008;
  undefined8 local_2000 [7];
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 auStack_1fb0 [2];
  undefined8 auStack_1fa0 [2];
  undefined8 auStack_1f90 [268];
  undefined4 local_1730;
  uint local_172c;
  long local_1728;
  int local_171c;
  int local_1718;
  int local_1714;
  long local_1710;
  int local_1704;
  long local_1700;
  ushort local_16f6;
  ushort local_16f4;
  ushort local_16f2;
  undefined1 local_16f0 [16];
  uint local_16d4;
  undefined1 local_16d0 [16];
  uint local_16b4;
  uint8_t *local_16b0;
  uint8_t *local_16a8;
  uint8_t *local_16a0;
  uint8_t *local_1698;
  uint8_t *local_1690;
  uint8_t *local_1688;
  ulong local_15f0;
  undefined8 uStack_15e8;
  undefined1 local_15e0 [32];
  ulong local_15b0;
  undefined8 uStack_15a8;
  undefined1 local_15a0 [32];
  ulong local_1570;
  undefined8 uStack_1568;
  undefined1 local_1560 [32];
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  __m256i *local_1520;
  __m256i *palStack_1518;
  __m256i *palStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  __m256i *palStack_12f8;
  __m256i *palStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  __m256i *palStack_12d8;
  __m256i *palStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  __m256i *palStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  __m256i *palStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 *local_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 *local_fc8;
  undefined8 *local_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 *local_f88;
  undefined8 *local_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 *local_f48;
  __m256i *local_f20;
  undefined8 uStack_f18;
  __m256i *local_f10;
  undefined8 uStack_f08;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 local_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 local_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 *local_e68;
  undefined8 local_e60;
  __m256i *palStack_e58;
  undefined8 *local_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 *local_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 *local_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 *local_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 *local_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 *local_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 *local_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 *local_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 *local_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 *local_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 *local_d10;
  uint local_d04;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 local_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined1 (*local_cd0) [16];
  undefined1 (*local_cc8) [16];
  undefined1 (*local_cc0) [16];
  undefined1 (*local_cb8) [16];
  undefined1 (*local_cb0) [16];
  undefined1 (*local_ca8) [16];
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  ulong local_9d0;
  undefined8 uStack_9c8;
  undefined1 local_9c0 [32];
  ulong local_990;
  undefined8 uStack_988;
  undefined1 local_980 [32];
  ulong local_950;
  undefined8 uStack_948;
  undefined1 local_940 [32];
  ulong local_910;
  undefined8 uStack_908;
  undefined1 local_900 [32];
  ulong local_8d0;
  undefined8 uStack_8c8;
  undefined1 local_8c0 [32];
  ulong local_890;
  undefined8 uStack_888;
  undefined1 local_880 [32];
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 *local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 *local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 *local_1f8;
  undefined1 (*local_1f0) [32];
  undefined1 (*local_1e8) [32];
  undefined8 *local_1e0;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined1 (*local_1b0) [32];
  undefined1 (*local_1a8) [32];
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined8 *local_188;
  undefined1 (*local_180) [32];
  undefined1 (*local_178) [32];
  undefined8 *local_170;
  undefined8 *local_168;
  undefined8 *local_160;
  undefined8 *local_158;
  undefined8 *local_150;
  undefined8 *local_148;
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  ushort local_120;
  ushort local_11e;
  ushort local_11c;
  ushort local_11a;
  ushort local_118;
  ushort local_116;
  ushort local_114;
  ushort local_112;
  ushort local_110;
  ushort local_10e;
  ushort local_10c;
  ushort local_10a;
  ushort local_108;
  ushort local_106;
  ushort local_104;
  ushort local_102;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  ushort local_e0;
  ushort local_de;
  ushort local_dc;
  ushort local_da;
  ushort local_d8;
  ushort local_d6;
  ushort local_d4;
  ushort local_d2;
  ushort local_d0;
  ushort local_ce;
  ushort local_cc;
  ushort local_ca;
  ushort local_c8;
  ushort local_c6;
  ushort local_c4;
  ushort local_c2;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  ushort local_a0;
  ushort local_9e;
  ushort local_9c;
  ushort local_9a;
  ushort local_98;
  ushort local_96;
  ushort local_94;
  ushort local_92;
  ushort local_90;
  ushort local_8e;
  ushort local_8c;
  ushort local_8a;
  ushort local_88;
  ushort local_86;
  ushort local_84;
  ushort local_82;
  undefined1 local_80 [16];
  undefined1 auStack_70 [16];
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  __m256i *res_unsigned_00;
  __m256i *data_ref_0_00;
  
  local_1728 = *(long *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 8);
  local_172c = *(uint *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x10);
  local_1730 = 8;
  local_171c = in_R9D;
  local_1718 = in_R8D;
  local_1714 = in_ECX;
  local_1710 = in_RDX;
  local_1704 = in_ESI;
  local_1700 = in_RDI;
  unpack_weights_avx2(in_stack_ffffffffffffcea8);
  iVar2 = *(int *)CONCAT44(in_stack_0000002c,subpel_y_qn);
  cVar41 = -((char)*(undefined4 *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x14) +
            (char)*(undefined4 *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x18));
  local_204c = cVar41 + 0x16;
  uVar82 = (1 << (local_204c & 0x1f)) + (1 << (cVar41 + 0x15U & 0x1f));
  local_2050 = (ushort)uVar82;
  local_16f2 = local_2050;
  local_102 = local_2050;
  local_104 = local_2050;
  local_106 = local_2050;
  local_108 = local_2050;
  local_10a = local_2050;
  local_10c = local_2050;
  local_10e = local_2050;
  local_110 = local_2050;
  local_112 = local_2050;
  local_114 = local_2050;
  local_116 = local_2050;
  local_118 = local_2050;
  local_11a = local_2050;
  local_11c = local_2050;
  local_11e = local_2050;
  local_120 = local_2050;
  auVar4 = vpinsrw_avx(ZEXT216(local_2050),uVar82 & 0xffff,1);
  auVar4 = vpinsrw_avx(auVar4,uVar82 & 0xffff,2);
  auVar4 = vpinsrw_avx(auVar4,uVar82 & 0xffff,3);
  auVar4 = vpinsrw_avx(auVar4,uVar82 & 0xffff,4);
  auVar4 = vpinsrw_avx(auVar4,uVar82 & 0xffff,5);
  auVar4 = vpinsrw_avx(auVar4,uVar82 & 0xffff,6);
  auVar5 = vpinsrw_avx(auVar4,uVar82 & 0xffff,7);
  auVar4 = vpinsrw_avx(ZEXT216(local_2050),uVar82 & 0xffff,1);
  auVar4 = vpinsrw_avx(auVar4,uVar82 & 0xffff,2);
  auVar4 = vpinsrw_avx(auVar4,uVar82 & 0xffff,3);
  auVar4 = vpinsrw_avx(auVar4,uVar82 & 0xffff,4);
  auVar4 = vpinsrw_avx(auVar4,uVar82 & 0xffff,5);
  auVar4 = vpinsrw_avx(auVar4,uVar82 & 0xffff,6);
  auStack_130 = vpinsrw_avx(auVar4,uVar82 & 0xffff,7);
  local_140._0_8_ = auVar5._0_8_;
  uVar70 = local_140._0_8_;
  local_140._8_8_ = auVar5._8_8_;
  uVar71 = local_140._8_8_;
  uVar72 = auStack_130._0_8_;
  uVar73 = auStack_130._8_8_;
  local_2084 = 0xe - ((char)*(undefined4 *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x14) +
                     (char)*(undefined4 *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x18));
  uVar82 = (uint)(1 << (local_2084 & 0x1f)) >> 1;
  local_16f4 = (ushort)uVar82;
  auVar4 = vpinsrw_avx(ZEXT216(local_16f4),uVar82 & 0xffff,1);
  auVar4 = vpinsrw_avx(auVar4,uVar82 & 0xffff,2);
  auVar4 = vpinsrw_avx(auVar4,uVar82 & 0xffff,3);
  auVar4 = vpinsrw_avx(auVar4,uVar82 & 0xffff,4);
  auVar4 = vpinsrw_avx(auVar4,uVar82 & 0xffff,5);
  auVar4 = vpinsrw_avx(auVar4,uVar82 & 0xffff,6);
  local_100 = vpinsrw_avx(auVar4,uVar82 & 0xffff,7);
  auVar4 = vpinsrw_avx(ZEXT216(local_16f4),uVar82 & 0xffff,1);
  auVar4 = vpinsrw_avx(auVar4,uVar82 & 0xffff,2);
  auVar4 = vpinsrw_avx(auVar4,uVar82 & 0xffff,3);
  auVar4 = vpinsrw_avx(auVar4,uVar82 & 0xffff,4);
  auVar4 = vpinsrw_avx(auVar4,uVar82 & 0xffff,5);
  auVar4 = vpinsrw_avx(auVar4,uVar82 & 0xffff,6);
  auStack_f0 = vpinsrw_avx(auVar4,uVar82 & 0xffff,7);
  local_16f6 = (short)((uint)(1 << (*(char *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x14) - 1U &
                                   0x1f)) >> 1) + 0x2000;
  auVar4 = vpinsrw_avx(ZEXT216(local_16f6),(uint)local_16f6,1);
  auVar4 = vpinsrw_avx(auVar4,(uint)local_16f6,2);
  auVar4 = vpinsrw_avx(auVar4,(uint)local_16f6,3);
  auVar4 = vpinsrw_avx(auVar4,(uint)local_16f6,4);
  auVar4 = vpinsrw_avx(auVar4,(uint)local_16f6,5);
  auVar4 = vpinsrw_avx(auVar4,(uint)local_16f6,6);
  auVar6 = vpinsrw_avx(auVar4,(uint)local_16f6,7);
  auVar4 = vpinsrw_avx(ZEXT216(local_16f6),(uint)local_16f6,1);
  auVar4 = vpinsrw_avx(auVar4,(uint)local_16f6,2);
  auVar4 = vpinsrw_avx(auVar4,(uint)local_16f6,3);
  auVar4 = vpinsrw_avx(auVar4,(uint)local_16f6,4);
  auVar4 = vpinsrw_avx(auVar4,(uint)local_16f6,5);
  auVar4 = vpinsrw_avx(auVar4,(uint)local_16f6,6);
  auStack_b0 = vpinsrw_avx(auVar4,(uint)local_16f6,7);
  local_c0._0_8_ = auVar6._0_8_;
  uVar74 = local_c0._0_8_;
  local_c0._8_8_ = auVar6._8_8_;
  uVar75 = local_c0._8_8_;
  uVar76 = auStack_b0._0_8_;
  uVar77 = auStack_b0._8_8_;
  local_16b4 = *(int *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x14) - 1;
  local_16d0._4_4_ = 0;
  local_16d0._0_4_ = local_16b4;
  uVar69 = local_16d0._0_8_;
  local_d04 = ((1 << (*(byte *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x18) & 0x1f)) >> 1) -
              (1 << (0x15U - *(char *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x14) & 0x1f));
  auVar4 = vpinsrd_avx(ZEXT416(local_d04),local_d04,1);
  auVar4 = vpinsrd_avx(auVar4,local_d04,2);
  auVar4 = vpinsrd_avx(auVar4,local_d04,3);
  auVar3 = vpinsrd_avx(ZEXT416(local_d04),local_d04,1);
  auVar3 = vpinsrd_avx(auVar3,local_d04,2);
  auStack_70 = vpinsrd_avx(auVar3,local_d04,3);
  local_80._0_8_ = auVar4._0_8_;
  uVar78 = local_80._0_8_;
  local_80._8_8_ = auVar4._8_8_;
  uVar79 = local_80._8_8_;
  uVar80 = auStack_70._0_8_;
  uVar81 = auStack_70._8_8_;
  local_16d4 = *(uint *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x18);
  local_16f0._4_4_ = 0;
  local_16f0._0_4_ = local_16d4;
  uVar68 = local_16f0._0_8_;
  local_1688 = "";
  local_1690 = 
  "\x02\x03\x03\x04\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\x02\x03\x03\x04\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\n\v\v\f\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\n\v\v\f\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e"
  ;
  local_16f0 = ZEXT416(local_16d4);
  local_16d0 = ZEXT416(local_16b4);
  local_140 = auVar5;
  local_e0 = local_16f4;
  local_de = local_16f4;
  local_dc = local_16f4;
  local_da = local_16f4;
  local_d8 = local_16f4;
  local_d6 = local_16f4;
  local_d4 = local_16f4;
  local_d2 = local_16f4;
  local_d0 = local_16f4;
  local_ce = local_16f4;
  local_cc = local_16f4;
  local_ca = local_16f4;
  local_c8 = local_16f4;
  local_c6 = local_16f4;
  local_c4 = local_16f4;
  local_c2 = local_16f4;
  local_c0 = auVar6;
  local_a0 = local_16f6;
  local_9e = local_16f6;
  local_9c = local_16f6;
  local_9a = local_16f6;
  local_98 = local_16f6;
  local_96 = local_16f6;
  local_94 = local_16f6;
  local_92 = local_16f6;
  local_90 = local_16f6;
  local_8e = local_16f6;
  local_8c = local_16f6;
  local_8a = local_16f6;
  local_88 = local_16f6;
  local_86 = local_16f6;
  local_84 = local_16f6;
  local_82 = local_16f6;
  local_80 = auVar4;
  local_50 = local_d04;
  local_4c = local_d04;
  local_48 = local_d04;
  local_44 = local_d04;
  local_40 = local_d04;
  local_3c = local_d04;
  local_38 = local_d04;
  local_34 = local_d04;
  prepare_coeffs_lowbd
            (in_stack_ffffffffffffcea0,in_stack_ffffffffffffce9c,in_stack_ffffffffffffce90);
  prepare_coeffs(in_stack_ffffffffffffce88,in_stack_ffffffffffffce84,in_stack_ffffffffffffce78);
  auVar3._8_8_ = uStack_21d8;
  auVar3._0_8_ = local_21e0;
  auVar9._8_8_ = uStack_2238;
  auVar9._0_8_ = local_2240;
  auVar3 = vpor_avx(auVar9,auVar3);
  auVar7._8_8_ = uStack_2258;
  auVar7._0_8_ = local_2260;
  auVar8._8_8_ = uStack_22b8;
  auVar8._0_8_ = local_22c0;
  auVar7 = vpor_avx(auVar8,auVar7);
  if (auVar3._0_4_ == 0) {
    iVar83 = local_171c + (uint)filter_params_x->taps + -1;
    iVar84 = (filter_params_x->taps / 2 - 1) * local_1704;
    for (local_22dc = 0; local_22dc < local_1718; local_22dc = local_22dc + 8) {
      local_22e8 = (undefined1 (*) [16])((local_1700 - iVar84) + -1 + (long)local_22dc);
      for (local_2008 = 0; local_2008 < iVar83; local_2008 = local_2008 + 2) {
        local_ca8 = local_22e8;
        local_ce0 = *(undefined8 *)*local_22e8;
        uStack_cd8 = *(undefined8 *)(*local_22e8 + 8);
        local_2320 = ZEXT1632(*local_22e8);
        if (local_2008 + 1 < iVar83) {
          local_cb0 = (undefined1 (*) [16])(*local_22e8 + local_1704);
          local_2320._0_16_ = ZEXT116(0) * *local_cb0 + ZEXT116(1) * *local_22e8;
          local_2320._16_16_ = ZEXT116(0) * ZEXT816(0) + ZEXT116(1) * *local_cb0;
        }
        local_22e8 = (undefined1 (*) [16])(*local_22e8 + (local_1704 << 1));
        data_00[0]._4_4_ = in_stack_ffffffffffffce9c;
        data_00[0]._0_4_ = in_stack_ffffffffffffce98;
        data_00[1] = (longlong)in_stack_ffffffffffffcea0;
        data_00[2] = (longlong)in_stack_ffffffffffffcea8;
        data_00[3] = (longlong)in_stack_ffffffffffffceb0;
        convolve_lowbd_x_4tap
                  (data_00,in_stack_ffffffffffffce90,(__m256i *)in_stack_ffffffffffffce88);
        local_2340._8_8_ = local_2320._8_8_;
        local_2340._0_8_ = local_2320._0_8_;
        local_1340 = uVar74;
        uStack_1338 = uVar75;
        uStack_1330 = uVar76;
        uStack_1328 = uVar77;
        auVar22._16_8_ = local_2320._16_8_;
        auVar22._0_16_ = local_2340;
        auVar22._24_8_ = local_2320._24_8_;
        auVar21._16_8_ = uVar76;
        auVar21._0_16_ = auVar6;
        auVar21._24_8_ = uVar77;
        local_1560 = vpaddw_avx2(auVar22,auVar21);
        local_1570 = uVar69;
        uStack_1568 = 0;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = uVar69;
        auVar89 = vpsraw_avx2(local_1560,auVar12);
        lVar86 = (long)(local_2008 * 8) * 2;
        local_1f8 = (undefined8 *)((long)local_2000 + lVar86);
        local_2340._0_8_ = auVar89._0_8_;
        local_2340._8_8_ = auVar89._8_8_;
        uStack_2330 = auVar89._16_8_;
        uStack_2328 = auVar89._24_8_;
        local_220 = local_2340._0_8_;
        uStack_218 = local_2340._8_8_;
        uStack_210 = uStack_2330;
        uStack_208 = uStack_2328;
        local_1320 = local_2320._0_8_;
        uStack_1318 = local_2320._8_8_;
        uStack_1310 = local_2320._16_8_;
        uStack_1308 = local_2320._24_8_;
        *local_1f8 = local_2340._0_8_;
        *(undefined8 *)((long)local_2000 + lVar86 + 8) = local_2340._8_8_;
        *(undefined8 *)((long)local_2000 + lVar86 + 0x10) = uStack_2330;
        *(undefined8 *)((long)local_2000 + lVar86 + 0x18) = uStack_2328;
      }
      local_148 = local_2000;
      auVar36._8_8_ = local_2000[1];
      auVar36._0_8_ = local_2000[0];
      auVar36._16_8_ = local_2000[2];
      auVar36._24_8_ = local_2000[3];
      auVar35._8_8_ = local_2000[1];
      auVar35._0_8_ = local_2000[0];
      auVar35._16_8_ = local_2000[2];
      auVar35._24_8_ = local_2000[3];
      local_150 = local_2000 + 2;
      auVar43._8_8_ = local_2000[3];
      auVar43._0_8_ = local_2000[2];
      auVar43._16_8_ = local_2000[4];
      auVar43._24_8_ = local_2000[5];
      auVar42._8_8_ = local_2000[3];
      auVar42._0_8_ = local_2000[2];
      auVar42._16_8_ = local_2000[4];
      auVar42._24_8_ = local_2000[5];
      local_158 = local_2000 + 4;
      auVar49._8_8_ = local_2000[5];
      auVar49._0_8_ = local_2000[4];
      auVar49._16_8_ = local_2000[6];
      auVar49._24_8_ = uStack_1fc8;
      auVar48._8_8_ = local_2000[5];
      auVar48._0_8_ = local_2000[4];
      auVar48._16_8_ = local_2000[6];
      auVar48._24_8_ = uStack_1fc8;
      local_160 = local_2000 + 6;
      auVar55._8_8_ = uStack_1fc8;
      auVar55._0_8_ = local_2000[6];
      auVar55._16_8_ = local_1fc0;
      auVar55._24_8_ = uStack_1fb8;
      auVar54._8_8_ = uStack_1fc8;
      auVar54._0_8_ = local_2000[6];
      auVar54._16_8_ = local_1fc0;
      auVar54._24_8_ = uStack_1fb8;
      local_168 = &local_1fc0;
      auVar61._8_8_ = uStack_1fb8;
      auVar61._0_8_ = local_1fc0;
      auVar61._16_8_ = auStack_1fb0[0];
      auVar61._24_8_ = auStack_1fb0[1];
      auVar60._8_8_ = uStack_1fb8;
      auVar60._0_8_ = local_1fc0;
      auVar60._16_8_ = auStack_1fb0[0];
      auVar60._24_8_ = auStack_1fb0[1];
      local_170 = auStack_1fb0;
      auVar65._8_8_ = auStack_1fb0[1];
      auVar65._0_8_ = auStack_1fb0[0];
      auVar65._16_8_ = auStack_1fa0[0];
      auVar65._24_8_ = auStack_1fa0[1];
      auVar64._8_8_ = auStack_1fb0[1];
      auVar64._0_8_ = auStack_1fb0[0];
      auVar64._16_8_ = auStack_1fa0[0];
      auVar64._24_8_ = auStack_1fa0[1];
      vpunpcklwd_avx2(auVar35,auVar42);
      vpunpcklwd_avx2(auVar48,auVar54);
      vpunpcklwd_avx2(auVar60,auVar64);
      vpunpckhwd_avx2(auVar36,auVar43);
      vpunpckhwd_avx2(auVar49,auVar55);
      vpunpckhwd_avx2(auVar61,auVar65);
      for (local_2008 = 0; local_2008 < local_171c; local_2008 = local_2008 + 2) {
        lVar86 = (long)(local_2008 * 8) * 2;
        local_178 = (undefined1 (*) [32])((long)auStack_1fa0 + lVar86);
        local_ac0 = *(undefined8 *)*local_178;
        uStack_ab8 = *(undefined8 *)((long)auStack_1f90 + lVar86 + -8);
        uStack_ab0 = *(undefined8 *)((long)auStack_1f90 + lVar86);
        uStack_aa8 = *(undefined8 *)((long)auStack_1f90 + lVar86 + 8);
        local_180 = (undefined1 (*) [32])((long)auStack_1f90 + lVar86);
        local_ae0 = *(undefined8 *)*local_180;
        uStack_ad8 = *(undefined8 *)((long)auStack_1f90 + lVar86 + 8);
        uStack_ad0 = *(undefined8 *)((long)auStack_1f90 + lVar86 + 0x10);
        uStack_ac8 = *(undefined8 *)((long)auStack_1f90 + lVar86 + 0x18);
        vpunpcklwd_avx2(*local_178,*local_180);
        auVar89 = vpunpckhwd_avx2(*local_178,*local_180);
        local_520 = local_ae0;
        uStack_518 = uStack_ad8;
        uStack_510 = uStack_ad0;
        uStack_508 = uStack_ac8;
        local_500 = local_ac0;
        uStack_4f8 = uStack_ab8;
        uStack_4f0 = uStack_ab0;
        uStack_4e8 = uStack_aa8;
        convolve(in_stack_ffffffffffffcef0,in_stack_ffffffffffffcee8);
        local_2580 = auVar89._0_8_;
        uStack_2578 = auVar89._8_8_;
        uStack_2570 = auVar89._16_8_;
        uStack_2568 = auVar89._24_8_;
        local_700 = local_2580;
        uStack_6f8 = uStack_2578;
        uStack_6f0 = uStack_2570;
        uStack_6e8 = uStack_2568;
        local_720 = uVar78;
        uStack_718 = uVar79;
        uStack_710 = uVar80;
        uStack_708 = uVar81;
        auVar34._16_8_ = uVar80;
        auVar34._0_16_ = auVar4;
        auVar34._24_8_ = uVar81;
        local_880 = vpaddd_avx2(auVar89,auVar34);
        local_890 = uVar68;
        uStack_888 = 0;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = uVar68;
        auVar89 = vpsrad_avx2(local_880,auVar28);
        local_25a0 = auVar89._0_8_;
        uStack_2598 = auVar89._8_8_;
        uStack_2590 = auVar89._16_8_;
        uStack_2588 = auVar89._24_8_;
        if (local_1718 - local_22dc < 5) {
          local_300 = local_25a0;
          uStack_2f8 = uStack_2598;
          uStack_2f0 = uStack_2590;
          uStack_2e8 = uStack_2588;
          local_320 = local_25a0;
          uStack_318 = uStack_2598;
          uStack_310 = uStack_2590;
          uStack_308 = uStack_2588;
          auVar89 = vpackssdw_avx2(auVar89,auVar89);
          local_2700 = auVar89._0_8_;
          uStack_26f8 = auVar89._8_8_;
          uStack_26f0 = auVar89._16_8_;
          uStack_26e8 = auVar89._24_8_;
          local_13a0 = local_2700;
          uStack_1398 = uStack_26f8;
          uStack_1390 = uStack_26f0;
          uStack_1388 = uStack_26e8;
          local_13c0 = uVar70;
          uStack_13b8 = uVar71;
          uStack_13b0 = uVar72;
          uStack_13a8 = uVar73;
          auVar19._16_8_ = uVar72;
          auVar19._0_16_ = auVar5;
          auVar19._24_8_ = uVar73;
          auVar89 = vpaddw_avx2(auVar89,auVar19);
          if (iVar2 == 0) {
            local_2720 = auVar89._0_8_;
            uStack_2718 = auVar89._8_8_;
            uStack_2710 = auVar89._16_8_;
            uStack_2708 = auVar89._24_8_;
            local_1080 = local_2720;
            uStack_1078 = uStack_2718;
            uStack_1070 = uStack_2710;
            uStack_1068 = uStack_2708;
            local_d48 = (undefined8 *)
                        (local_1728 + (long)(int)(local_2008 * local_172c + local_22dc) * 2);
            local_d60 = local_2720;
            uStack_d58 = uStack_2718;
            *local_d48 = local_2720;
            local_d48[1] = uStack_2718;
            local_d68 = (undefined8 *)
                        (local_1728 +
                        (long)(int)(local_2008 * local_172c + local_22dc + local_172c) * 2);
            local_d80 = uStack_2710;
            uStack_d78 = uStack_2708;
            *local_d68 = uStack_2710;
            local_d68[1] = uStack_2708;
          }
          else {
            iVar85 = local_2008 * local_172c + local_22dc;
            load_line2_avx2((__m256i *)(local_1728 + (long)iVar85 * 2),
                            (void *)(local_1728 + (long)(int)(iVar85 + local_172c) * 2),
                            (void *)(ulong)local_172c);
            comp_avg(data_ref_0_00,res_unsigned_00,wt_00,use_dist_wtd_comp_avg_00);
            convolve_rounding(in_stack_ffffffffffffce90,(__m256i *)in_stack_ffffffffffffce88,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffce84,in_stack_ffffffffffffce80),
                              (int)((ulong)in_stack_ffffffffffffce78 >> 0x20));
            local_2780 = auVar89._0_8_;
            uStack_2778 = auVar89._8_8_;
            uStack_2770 = auVar89._16_8_;
            uStack_2768 = auVar89._24_8_;
            local_11e0 = local_2780;
            uStack_11d8 = uStack_2778;
            uStack_11d0 = uStack_2770;
            uStack_11c8 = uStack_2768;
            local_1200 = local_2780;
            uStack_11f8 = uStack_2778;
            uStack_11f0 = uStack_2770;
            uStack_11e8 = uStack_2768;
            auVar89 = vpackuswb_avx2(auVar89,auVar89);
            local_27a0 = auVar89._0_8_;
            uStack_2798 = auVar89._8_8_;
            uStack_2790 = auVar89._16_8_;
            uStack_2788 = auVar89._24_8_;
            local_1060 = local_27a0;
            uStack_1058 = uStack_2798;
            uStack_1050 = uStack_2790;
            uStack_1048 = uStack_2788;
            uStack_e98 = uStack_2788;
            local_e90 = uStack_2790;
            local_ea0._0_4_ = auVar89._16_4_;
            *(undefined4 *)(local_1710 + (local_2008 * local_1714 + local_22dc)) =
                 (undefined4)local_ea0;
            *(undefined4 *)(local_1710 + (local_2008 * local_1714 + local_22dc + local_1714)) =
                 local_27c0;
            local_ea0 = local_e90;
            uStack_e88 = uStack_e98;
          }
        }
        else {
          auVar88 = auVar89;
          convolve(in_stack_ffffffffffffcef0,in_stack_ffffffffffffcee8);
          local_25c0 = auVar88._0_8_;
          uStack_25b8 = auVar88._8_8_;
          uStack_25b0 = auVar88._16_8_;
          uStack_25a8 = auVar88._24_8_;
          local_740 = local_25c0;
          uStack_738 = uStack_25b8;
          uStack_730 = uStack_25b0;
          uStack_728 = uStack_25a8;
          local_760 = uVar78;
          uStack_758 = uVar79;
          uStack_750 = uVar80;
          uStack_748 = uVar81;
          auVar33._16_8_ = uVar80;
          auVar33._0_16_ = auVar4;
          auVar33._24_8_ = uVar81;
          local_8c0 = vpaddd_avx2(auVar88,auVar33);
          local_8d0 = uVar68;
          uStack_8c8 = 0;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = uVar68;
          auVar88 = vpsrad_avx2(local_8c0,auVar27);
          local_25e0 = auVar88._0_8_;
          uStack_25d8 = auVar88._8_8_;
          uStack_25d0 = auVar88._16_8_;
          uStack_25c8 = auVar88._24_8_;
          local_2c0 = local_25a0;
          uStack_2b8 = uStack_2598;
          uStack_2b0 = uStack_2590;
          uStack_2a8 = uStack_2588;
          local_2e0 = local_25e0;
          uStack_2d8 = uStack_25d8;
          uStack_2d0 = uStack_25d0;
          uStack_2c8 = uStack_25c8;
          auVar89 = vpackssdw_avx2(auVar89,auVar88);
          local_2600 = auVar89._0_8_;
          uStack_25f8 = auVar89._8_8_;
          uStack_25f0 = auVar89._16_8_;
          uStack_25e8 = auVar89._24_8_;
          local_1360 = local_2600;
          uStack_1358 = uStack_25f8;
          uStack_1350 = uStack_25f0;
          uStack_1348 = uStack_25e8;
          local_1380 = uVar70;
          uStack_1378 = uVar71;
          uStack_1370 = uVar72;
          uStack_1368 = uVar73;
          auVar20._16_8_ = uVar72;
          auVar20._0_16_ = auVar5;
          auVar20._24_8_ = uVar73;
          auVar89 = vpaddw_avx2(auVar89,auVar20);
          if (iVar2 == 0) {
            local_2620 = auVar89._0_8_;
            uStack_2618 = auVar89._8_8_;
            uStack_2610 = auVar89._16_8_;
            uStack_2608 = auVar89._24_8_;
            local_1040 = local_2620;
            uStack_1038 = uStack_2618;
            uStack_1030 = uStack_2610;
            uStack_1028 = uStack_2608;
            local_d10 = (undefined8 *)
                        (local_1728 + (long)(int)(local_2008 * local_172c + local_22dc) * 2);
            local_d20 = local_2620;
            uStack_d18 = uStack_2618;
            *local_d10 = local_2620;
            local_d10[1] = uStack_2618;
            local_d28 = (undefined8 *)
                        (local_1728 +
                        (long)(int)(local_2008 * local_172c + local_22dc + local_172c) * 2);
            local_d40 = uStack_2610;
            uStack_d38 = uStack_2608;
            *local_d28 = uStack_2610;
            local_d28[1] = uStack_2608;
          }
          else {
            iVar85 = local_2008 * local_172c + local_22dc;
            load_line2_avx2((__m256i *)(local_1728 + (long)iVar85 * 2),
                            (void *)(local_1728 + (long)(int)(iVar85 + local_172c) * 2),
                            (void *)(ulong)local_172c);
            comp_avg(data_ref_0_00,res_unsigned_00,wt_00,use_dist_wtd_comp_avg_00);
            convolve_rounding(in_stack_ffffffffffffce90,(__m256i *)in_stack_ffffffffffffce88,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffce84,in_stack_ffffffffffffce80),
                              (int)((ulong)in_stack_ffffffffffffce78 >> 0x20));
            local_2680 = auVar89._0_8_;
            uStack_2678 = auVar89._8_8_;
            uStack_2670 = auVar89._16_8_;
            uStack_2668 = auVar89._24_8_;
            local_11a0 = local_2680;
            uStack_1198 = uStack_2678;
            uStack_1190 = uStack_2670;
            uStack_1188 = uStack_2668;
            local_11c0 = local_2680;
            uStack_11b8 = uStack_2678;
            uStack_11b0 = uStack_2670;
            uStack_11a8 = uStack_2668;
            auVar89 = vpackuswb_avx2(auVar89,auVar89);
            local_26a0 = auVar89._0_8_;
            uStack_2698 = auVar89._8_8_;
            uStack_2690 = auVar89._16_8_;
            uStack_2688 = auVar89._24_8_;
            local_1020 = local_26a0;
            uStack_1018 = uStack_2698;
            uStack_1010 = uStack_2690;
            uStack_1008 = uStack_2688;
            uStack_f58 = uStack_2688;
            local_f60 = uStack_2690;
            local_f48 = (undefined8 *)(local_1710 + (local_2008 * local_1714 + local_22dc));
            *local_f48 = uStack_2690;
            local_f68 = (undefined8 *)
                        (local_1710 + (local_2008 * local_1714 + local_22dc + local_1714));
            *local_f68 = local_26c0;
          }
        }
      }
    }
  }
  else if (auVar7._0_4_ == 0) {
    iVar83 = local_171c + 3;
    uVar1 = *(ushort *)(in_stack_00000008 + 8);
    lVar86 = (long)local_1704;
    local_1698 = 
    "\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\n\v\v\f\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\n\v\v\f\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e"
    ;
    local_16a0 = "\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e";
    for (local_27fc = 0; local_27fc < local_1718; local_27fc = local_27fc + 8) {
      local_2808 = (undefined1 (*) [16])
                   (((local_1700 - lVar86) - (long)(int)(uVar1 / 2 - 1)) + (long)local_27fc);
      for (local_2008 = 0; local_2008 < iVar83; local_2008 = local_2008 + 2) {
        local_cb8 = local_2808;
        local_cf0 = *(undefined8 *)*local_2808;
        uStack_ce8 = *(undefined8 *)(*local_2808 + 8);
        local_2840 = ZEXT1632(*local_2808);
        if (local_2008 + 1 < iVar83) {
          local_cc0 = (undefined1 (*) [16])(*local_2808 + local_1704);
          local_2840._0_16_ = ZEXT116(0) * *local_cc0 + ZEXT116(1) * *local_2808;
          local_2840._16_16_ = ZEXT116(0) * ZEXT816(0) + ZEXT116(1) * *local_cc0;
        }
        local_2808 = (undefined1 (*) [16])(*local_2808 + (local_1704 << 1));
        data_01[1] = in_stack_ffffffffffffcee0;
        data_01[0] = in_stack_ffffffffffffced8;
        data_01[2] = (longlong)in_stack_ffffffffffffcee8;
        data_01[3] = (longlong)in_stack_ffffffffffffcef0;
        convolve_lowbd_x(data_01,in_stack_ffffffffffffced0,in_stack_ffffffffffffcec8);
        local_2860._8_8_ = local_2840._8_8_;
        local_2860._0_8_ = local_2840._0_8_;
        local_1400 = uVar74;
        uStack_13f8 = uVar75;
        uStack_13f0 = uVar76;
        uStack_13e8 = uVar77;
        auVar18._16_8_ = local_2840._16_8_;
        auVar18._0_16_ = local_2860;
        auVar18._24_8_ = local_2840._24_8_;
        auVar17._16_8_ = uVar76;
        auVar17._0_16_ = auVar6;
        auVar17._24_8_ = uVar77;
        local_15a0 = vpaddw_avx2(auVar18,auVar17);
        local_15b0 = uVar69;
        uStack_15a8 = 0;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = uVar69;
        auVar89 = vpsraw_avx2(local_15a0,auVar11);
        lVar87 = (long)(local_2008 * 8) * 2;
        local_228 = (undefined8 *)((long)local_2000 + lVar87);
        local_2860._0_8_ = auVar89._0_8_;
        local_2860._8_8_ = auVar89._8_8_;
        uStack_2850 = auVar89._16_8_;
        uStack_2848 = auVar89._24_8_;
        local_260 = local_2860._0_8_;
        uStack_258 = local_2860._8_8_;
        uStack_250 = uStack_2850;
        uStack_248 = uStack_2848;
        local_13e0 = local_2840._0_8_;
        uStack_13d8 = local_2840._8_8_;
        uStack_13d0 = local_2840._16_8_;
        uStack_13c8 = local_2840._24_8_;
        *local_228 = local_2860._0_8_;
        *(undefined8 *)((long)local_2000 + lVar87 + 8) = local_2860._8_8_;
        *(undefined8 *)((long)local_2000 + lVar87 + 0x10) = uStack_2850;
        *(undefined8 *)((long)local_2000 + lVar87 + 0x18) = uStack_2848;
      }
      local_188 = local_2000;
      auVar38._8_8_ = local_2000[1];
      auVar38._0_8_ = local_2000[0];
      auVar38._16_8_ = local_2000[2];
      auVar38._24_8_ = local_2000[3];
      auVar37._8_8_ = local_2000[1];
      auVar37._0_8_ = local_2000[0];
      auVar37._16_8_ = local_2000[2];
      auVar37._24_8_ = local_2000[3];
      local_190 = local_2000 + 2;
      auVar45._8_8_ = local_2000[3];
      auVar45._0_8_ = local_2000[2];
      auVar45._16_8_ = local_2000[4];
      auVar45._24_8_ = local_2000[5];
      auVar44._8_8_ = local_2000[3];
      auVar44._0_8_ = local_2000[2];
      auVar44._16_8_ = local_2000[4];
      auVar44._24_8_ = local_2000[5];
      local_198 = local_2000 + 4;
      auVar51._8_8_ = local_2000[5];
      auVar51._0_8_ = local_2000[4];
      auVar51._16_8_ = local_2000[6];
      auVar51._24_8_ = uStack_1fc8;
      auVar50._8_8_ = local_2000[5];
      auVar50._0_8_ = local_2000[4];
      auVar50._16_8_ = local_2000[6];
      auVar50._24_8_ = uStack_1fc8;
      local_1a0 = local_2000 + 6;
      auVar57._8_8_ = uStack_1fc8;
      auVar57._0_8_ = local_2000[6];
      auVar57._16_8_ = local_1fc0;
      auVar57._24_8_ = uStack_1fb8;
      auVar56._8_8_ = uStack_1fc8;
      auVar56._0_8_ = local_2000[6];
      auVar56._16_8_ = local_1fc0;
      auVar56._24_8_ = uStack_1fb8;
      vpunpcklwd_avx2(auVar37,auVar44);
      vpunpcklwd_avx2(auVar50,auVar56);
      vpunpckhwd_avx2(auVar38,auVar45);
      vpunpckhwd_avx2(auVar51,auVar57);
      for (local_2008 = 0; local_2008 < local_171c; local_2008 = local_2008 + 2) {
        lVar87 = (long)(local_2008 * 8) * 2;
        local_1a8 = (undefined1 (*) [32])((long)&local_1fc0 + lVar87);
        local_b80 = *(undefined8 *)*local_1a8;
        uStack_b78 = *(undefined8 *)((long)&uStack_1fb8 + lVar87);
        uStack_b70 = *(undefined8 *)((long)auStack_1fb0 + lVar87);
        uStack_b68 = *(undefined8 *)((long)auStack_1fb0 + lVar87 + 8);
        local_1b0 = (undefined1 (*) [32])((long)auStack_1fb0 + lVar87);
        local_ba0 = *(undefined8 *)*local_1b0;
        uStack_b98 = *(undefined8 *)((long)auStack_1fb0 + lVar87 + 8);
        uStack_b90 = *(undefined8 *)((long)auStack_1fa0 + lVar87);
        uStack_b88 = *(undefined8 *)((long)auStack_1f90 + lVar87 + -8);
        vpunpcklwd_avx2(*local_1a8,*local_1b0);
        auVar89 = vpunpckhwd_avx2(*local_1a8,*local_1b0);
        local_5e0 = local_ba0;
        uStack_5d8 = uStack_b98;
        uStack_5d0 = uStack_b90;
        uStack_5c8 = uStack_b88;
        local_5c0 = local_b80;
        uStack_5b8 = uStack_b78;
        uStack_5b0 = uStack_b70;
        uStack_5a8 = uStack_b68;
        convolve_4tap(in_stack_ffffffffffffceb0,(__m256i *)in_stack_ffffffffffffcea8);
        local_2a20 = auVar89._0_8_;
        uStack_2a18 = auVar89._8_8_;
        uStack_2a10 = auVar89._16_8_;
        uStack_2a08 = auVar89._24_8_;
        local_780 = local_2a20;
        uStack_778 = uStack_2a18;
        uStack_770 = uStack_2a10;
        uStack_768 = uStack_2a08;
        local_7a0 = uVar78;
        uStack_798 = uVar79;
        uStack_790 = uVar80;
        uStack_788 = uVar81;
        auVar32._16_8_ = uVar80;
        auVar32._0_16_ = auVar4;
        auVar32._24_8_ = uVar81;
        local_900 = vpaddd_avx2(auVar89,auVar32);
        local_910 = uVar68;
        uStack_908 = 0;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = uVar68;
        auVar89 = vpsrad_avx2(local_900,auVar26);
        local_2a40 = auVar89._0_8_;
        uStack_2a38 = auVar89._8_8_;
        uStack_2a30 = auVar89._16_8_;
        uStack_2a28 = auVar89._24_8_;
        if (local_1718 - local_27fc < 5) {
          local_380 = local_2a40;
          uStack_378 = uStack_2a38;
          uStack_370 = uStack_2a30;
          uStack_368 = uStack_2a28;
          local_3a0 = local_2a40;
          uStack_398 = uStack_2a38;
          uStack_390 = uStack_2a30;
          uStack_388 = uStack_2a28;
          auVar89 = vpackssdw_avx2(auVar89,auVar89);
          local_2ba0 = auVar89._0_8_;
          uStack_2b98 = auVar89._8_8_;
          uStack_2b90 = auVar89._16_8_;
          uStack_2b88 = auVar89._24_8_;
          local_1460 = local_2ba0;
          uStack_1458 = uStack_2b98;
          uStack_1450 = uStack_2b90;
          uStack_1448 = uStack_2b88;
          local_1480 = uVar70;
          uStack_1478 = uVar71;
          uStack_1470 = uVar72;
          uStack_1468 = uVar73;
          auVar15._16_8_ = uVar72;
          auVar15._0_16_ = auVar5;
          auVar15._24_8_ = uVar73;
          auVar89 = vpaddw_avx2(auVar89,auVar15);
          if (iVar2 == 0) {
            local_2bc0 = auVar89._0_8_;
            uStack_2bb8 = auVar89._8_8_;
            uStack_2bb0 = auVar89._16_8_;
            uStack_2ba8 = auVar89._24_8_;
            local_1100 = local_2bc0;
            uStack_10f8 = uStack_2bb8;
            uStack_10f0 = uStack_2bb0;
            uStack_10e8 = uStack_2ba8;
            local_dc8 = (undefined8 *)
                        (local_1728 + (long)(int)(local_2008 * local_172c + local_27fc) * 2);
            local_de0 = local_2bc0;
            uStack_dd8 = uStack_2bb8;
            *local_dc8 = local_2bc0;
            local_dc8[1] = uStack_2bb8;
            local_de8 = (undefined8 *)
                        (local_1728 +
                        (long)(int)(local_2008 * local_172c + local_27fc + local_172c) * 2);
            local_e00 = uStack_2bb0;
            uStack_df8 = uStack_2ba8;
            *local_de8 = uStack_2bb0;
            local_de8[1] = uStack_2ba8;
          }
          else {
            iVar84 = local_2008 * local_172c + local_27fc;
            load_line2_avx2((__m256i *)(local_1728 + (long)iVar84 * 2),
                            (void *)(local_1728 + (long)(int)(iVar84 + local_172c) * 2),
                            (void *)(ulong)local_172c);
            comp_avg(data_ref_0_00,res_unsigned_00,wt_00,use_dist_wtd_comp_avg_00);
            convolve_rounding(in_stack_ffffffffffffce90,(__m256i *)in_stack_ffffffffffffce88,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffce84,in_stack_ffffffffffffce80),
                              (int)((ulong)in_stack_ffffffffffffce78 >> 0x20));
            local_2c20 = auVar89._0_8_;
            uStack_2c18 = auVar89._8_8_;
            uStack_2c10 = auVar89._16_8_;
            uStack_2c08 = auVar89._24_8_;
            local_1260 = local_2c20;
            uStack_1258 = uStack_2c18;
            uStack_1250 = uStack_2c10;
            uStack_1248 = uStack_2c08;
            local_1280 = local_2c20;
            uStack_1278 = uStack_2c18;
            uStack_1270 = uStack_2c10;
            uStack_1268 = uStack_2c08;
            auVar89 = vpackuswb_avx2(auVar89,auVar89);
            local_2c40 = auVar89._0_8_;
            uStack_2c38 = auVar89._8_8_;
            uStack_2c30 = auVar89._16_8_;
            uStack_2c28 = auVar89._24_8_;
            local_10e0 = local_2c40;
            uStack_10d8 = uStack_2c38;
            uStack_10d0 = uStack_2c30;
            uStack_10c8 = uStack_2c28;
            uStack_ed8 = uStack_2c28;
            local_ed0 = uStack_2c30;
            local_ee0._0_4_ = auVar89._16_4_;
            *(undefined4 *)(local_1710 + (local_2008 * local_1714 + local_27fc)) =
                 (undefined4)local_ee0;
            *(undefined4 *)(local_1710 + (local_2008 * local_1714 + local_27fc + local_1714)) =
                 local_2c60;
            local_ee0 = local_ed0;
            uStack_ec8 = uStack_ed8;
          }
        }
        else {
          auVar88 = auVar89;
          convolve_4tap(in_stack_ffffffffffffceb0,(__m256i *)in_stack_ffffffffffffcea8);
          local_2a60 = auVar88._0_8_;
          uStack_2a58 = auVar88._8_8_;
          uStack_2a50 = auVar88._16_8_;
          uStack_2a48 = auVar88._24_8_;
          local_7c0 = local_2a60;
          uStack_7b8 = uStack_2a58;
          uStack_7b0 = uStack_2a50;
          uStack_7a8 = uStack_2a48;
          local_7e0 = uVar78;
          uStack_7d8 = uVar79;
          uStack_7d0 = uVar80;
          uStack_7c8 = uVar81;
          auVar31._16_8_ = uVar80;
          auVar31._0_16_ = auVar4;
          auVar31._24_8_ = uVar81;
          local_940 = vpaddd_avx2(auVar88,auVar31);
          local_950 = uVar68;
          uStack_948 = 0;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = uVar68;
          auVar88 = vpsrad_avx2(local_940,auVar25);
          local_2a80 = auVar88._0_8_;
          uStack_2a78 = auVar88._8_8_;
          uStack_2a70 = auVar88._16_8_;
          uStack_2a68 = auVar88._24_8_;
          local_340 = local_2a40;
          uStack_338 = uStack_2a38;
          uStack_330 = uStack_2a30;
          uStack_328 = uStack_2a28;
          local_360 = local_2a80;
          uStack_358 = uStack_2a78;
          uStack_350 = uStack_2a70;
          uStack_348 = uStack_2a68;
          auVar89 = vpackssdw_avx2(auVar89,auVar88);
          local_2aa0 = auVar89._0_8_;
          uStack_2a98 = auVar89._8_8_;
          uStack_2a90 = auVar89._16_8_;
          uStack_2a88 = auVar89._24_8_;
          local_1420 = local_2aa0;
          uStack_1418 = uStack_2a98;
          uStack_1410 = uStack_2a90;
          uStack_1408 = uStack_2a88;
          local_1440 = uVar70;
          uStack_1438 = uVar71;
          uStack_1430 = uVar72;
          uStack_1428 = uVar73;
          auVar16._16_8_ = uVar72;
          auVar16._0_16_ = auVar5;
          auVar16._24_8_ = uVar73;
          auVar89 = vpaddw_avx2(auVar89,auVar16);
          if (iVar2 == 0) {
            local_2ac0 = auVar89._0_8_;
            uStack_2ab8 = auVar89._8_8_;
            uStack_2ab0 = auVar89._16_8_;
            uStack_2aa8 = auVar89._24_8_;
            local_10c0 = local_2ac0;
            uStack_10b8 = uStack_2ab8;
            uStack_10b0 = uStack_2ab0;
            uStack_10a8 = uStack_2aa8;
            local_d88 = (undefined8 *)
                        (local_1728 + (long)(int)(local_2008 * local_172c + local_27fc) * 2);
            local_da0 = local_2ac0;
            uStack_d98 = uStack_2ab8;
            *local_d88 = local_2ac0;
            local_d88[1] = uStack_2ab8;
            local_da8 = (undefined8 *)
                        (local_1728 +
                        (long)(int)(local_2008 * local_172c + local_27fc + local_172c) * 2);
            local_dc0 = uStack_2ab0;
            uStack_db8 = uStack_2aa8;
            *local_da8 = uStack_2ab0;
            local_da8[1] = uStack_2aa8;
          }
          else {
            iVar84 = local_2008 * local_172c + local_27fc;
            load_line2_avx2((__m256i *)(local_1728 + (long)iVar84 * 2),
                            (void *)(local_1728 + (long)(int)(iVar84 + local_172c) * 2),
                            (void *)(ulong)local_172c);
            comp_avg(data_ref_0_00,res_unsigned_00,wt_00,use_dist_wtd_comp_avg_00);
            convolve_rounding(in_stack_ffffffffffffce90,(__m256i *)in_stack_ffffffffffffce88,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffce84,in_stack_ffffffffffffce80),
                              (int)((ulong)in_stack_ffffffffffffce78 >> 0x20));
            local_2b20 = auVar89._0_8_;
            uStack_2b18 = auVar89._8_8_;
            uStack_2b10 = auVar89._16_8_;
            uStack_2b08 = auVar89._24_8_;
            local_1220 = local_2b20;
            uStack_1218 = uStack_2b18;
            uStack_1210 = uStack_2b10;
            uStack_1208 = uStack_2b08;
            local_1240 = local_2b20;
            uStack_1238 = uStack_2b18;
            uStack_1230 = uStack_2b10;
            uStack_1228 = uStack_2b08;
            auVar89 = vpackuswb_avx2(auVar89,auVar89);
            local_2b40 = auVar89._0_8_;
            uStack_2b38 = auVar89._8_8_;
            uStack_2b30 = auVar89._16_8_;
            uStack_2b28 = auVar89._24_8_;
            local_10a0 = local_2b40;
            uStack_1098 = uStack_2b38;
            uStack_1090 = uStack_2b30;
            uStack_1088 = uStack_2b28;
            uStack_f98 = uStack_2b28;
            local_fa0 = uStack_2b30;
            local_f88 = (undefined8 *)(local_1710 + (local_2008 * local_1714 + local_27fc));
            *local_f88 = uStack_2b30;
            local_fa8 = (undefined8 *)
                        (local_1710 + (local_2008 * local_1714 + local_27fc + local_1714));
            *local_fa8 = local_2b60;
          }
        }
      }
    }
  }
  else {
    iVar83 = local_171c + (uint)filter_params_x->taps + -1;
    uVar1 = *(ushort *)(in_stack_00000008 + 8);
    iVar84 = (filter_params_x->taps / 2 - 1) * local_1704;
    local_16a8 = 
    "\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\n\v\v\f\x04\x05\x05\x06\x06\a\a\b\b\t\t\n\n\v\v\f\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e"
    ;
    local_16b0 = "\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e\x06\a\a\b\b\t\t\n\n\v\v\f\f\r\r\x0e";
    for (local_2c9c = 0; local_2c9c < local_1718; local_2c9c = local_2c9c + 8) {
      local_2ca8 = (undefined1 (*) [16])
                   (((local_1700 - iVar84) - (long)(int)(uVar1 / 2 - 1)) + (long)local_2c9c);
      for (local_2008 = 0; local_2008 < iVar83; local_2008 = local_2008 + 2) {
        local_cc8 = local_2ca8;
        local_d00 = *(undefined8 *)*local_2ca8;
        uStack_cf8 = *(undefined8 *)(*local_2ca8 + 8);
        local_2ce0 = ZEXT1632(*local_2ca8);
        if (local_2008 + 1 < iVar83) {
          local_cd0 = (undefined1 (*) [16])(*local_2ca8 + local_1704);
          local_2ce0._0_16_ = ZEXT116(0) * *local_cd0 + ZEXT116(1) * *local_2ca8;
          local_2ce0._16_16_ = ZEXT116(0) * ZEXT816(0) + ZEXT116(1) * *local_cd0;
        }
        local_2ca8 = (undefined1 (*) [16])(*local_2ca8 + (local_1704 << 1));
        data_02[1] = in_stack_ffffffffffffcee0;
        data_02[0] = in_stack_ffffffffffffced8;
        data_02[2] = (longlong)in_stack_ffffffffffffcee8;
        data_02[3] = (longlong)in_stack_ffffffffffffcef0;
        convolve_lowbd_x(data_02,in_stack_ffffffffffffced0,in_stack_ffffffffffffcec8);
        local_2d00._8_8_ = local_2ce0._8_8_;
        local_2d00._0_8_ = local_2ce0._0_8_;
        local_14c0 = uVar74;
        uStack_14b8 = uVar75;
        uStack_14b0 = uVar76;
        uStack_14a8 = uVar77;
        auVar88._16_8_ = local_2ce0._16_8_;
        auVar88._0_16_ = local_2d00;
        auVar88._24_8_ = local_2ce0._24_8_;
        auVar89._16_8_ = uVar76;
        auVar89._0_16_ = auVar6;
        auVar89._24_8_ = uVar77;
        local_15e0 = vpaddw_avx2(auVar88,auVar89);
        local_15f0 = uVar69;
        uStack_15e8 = 0;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar69;
        auVar89 = vpsraw_avx2(local_15e0,auVar10);
        lVar86 = (long)(local_2008 * 8) * 2;
        local_268 = (undefined8 *)((long)local_2000 + lVar86);
        local_2d00._0_8_ = auVar89._0_8_;
        local_2d00._8_8_ = auVar89._8_8_;
        uStack_2cf0 = auVar89._16_8_;
        uStack_2ce8 = auVar89._24_8_;
        local_2a0 = local_2d00._0_8_;
        uStack_298 = local_2d00._8_8_;
        uStack_290 = uStack_2cf0;
        uStack_288 = uStack_2ce8;
        local_14a0 = local_2ce0._0_8_;
        uStack_1498 = local_2ce0._8_8_;
        uStack_1490 = local_2ce0._16_8_;
        uStack_1488 = local_2ce0._24_8_;
        *local_268 = local_2d00._0_8_;
        *(undefined8 *)((long)local_2000 + lVar86 + 8) = local_2d00._8_8_;
        *(undefined8 *)((long)local_2000 + lVar86 + 0x10) = uStack_2cf0;
        *(undefined8 *)((long)local_2000 + lVar86 + 0x18) = uStack_2ce8;
      }
      local_1b8 = local_2000;
      auVar40._8_8_ = local_2000[1];
      auVar40._0_8_ = local_2000[0];
      auVar40._16_8_ = local_2000[2];
      auVar40._24_8_ = local_2000[3];
      auVar39._8_8_ = local_2000[1];
      auVar39._0_8_ = local_2000[0];
      auVar39._16_8_ = local_2000[2];
      auVar39._24_8_ = local_2000[3];
      local_1c0 = local_2000 + 2;
      auVar47._8_8_ = local_2000[3];
      auVar47._0_8_ = local_2000[2];
      auVar47._16_8_ = local_2000[4];
      auVar47._24_8_ = local_2000[5];
      auVar46._8_8_ = local_2000[3];
      auVar46._0_8_ = local_2000[2];
      auVar46._16_8_ = local_2000[4];
      auVar46._24_8_ = local_2000[5];
      local_1c8 = local_2000 + 4;
      auVar53._8_8_ = local_2000[5];
      auVar53._0_8_ = local_2000[4];
      auVar53._16_8_ = local_2000[6];
      auVar53._24_8_ = uStack_1fc8;
      auVar52._8_8_ = local_2000[5];
      auVar52._0_8_ = local_2000[4];
      auVar52._16_8_ = local_2000[6];
      auVar52._24_8_ = uStack_1fc8;
      local_1d0 = local_2000 + 6;
      auVar59._8_8_ = uStack_1fc8;
      auVar59._0_8_ = local_2000[6];
      auVar59._16_8_ = local_1fc0;
      auVar59._24_8_ = uStack_1fb8;
      auVar58._8_8_ = uStack_1fc8;
      auVar58._0_8_ = local_2000[6];
      auVar58._16_8_ = local_1fc0;
      auVar58._24_8_ = uStack_1fb8;
      local_1d8 = &local_1fc0;
      auVar63._8_8_ = uStack_1fb8;
      auVar63._0_8_ = local_1fc0;
      auVar63._16_8_ = auStack_1fb0[0];
      auVar63._24_8_ = auStack_1fb0[1];
      auVar62._8_8_ = uStack_1fb8;
      auVar62._0_8_ = local_1fc0;
      auVar62._16_8_ = auStack_1fb0[0];
      auVar62._24_8_ = auStack_1fb0[1];
      local_1e0 = auStack_1fb0;
      auVar67._8_8_ = auStack_1fb0[1];
      auVar67._0_8_ = auStack_1fb0[0];
      auVar67._16_8_ = auStack_1fa0[0];
      auVar67._24_8_ = auStack_1fa0[1];
      auVar66._8_8_ = auStack_1fb0[1];
      auVar66._0_8_ = auStack_1fb0[0];
      auVar66._16_8_ = auStack_1fa0[0];
      auVar66._24_8_ = auStack_1fa0[1];
      vpunpcklwd_avx2(auVar39,auVar46);
      vpunpcklwd_avx2(auVar52,auVar58);
      vpunpcklwd_avx2(auVar62,auVar66);
      vpunpckhwd_avx2(auVar40,auVar47);
      vpunpckhwd_avx2(auVar53,auVar59);
      vpunpckhwd_avx2(auVar63,auVar67);
      for (local_2008 = 0; local_2008 < local_171c; local_2008 = local_2008 + 2) {
        lVar86 = (long)(local_2008 * 8) * 2;
        local_1e8 = (undefined1 (*) [32])((long)auStack_1fa0 + lVar86);
        local_c80 = *(undefined8 *)*local_1e8;
        uStack_c78 = *(undefined8 *)((long)auStack_1f90 + lVar86 + -8);
        uStack_c70 = *(undefined8 *)((long)auStack_1f90 + lVar86);
        uStack_c68 = *(undefined8 *)((long)auStack_1f90 + lVar86 + 8);
        local_1f0 = (undefined1 (*) [32])((long)auStack_1f90 + lVar86);
        local_ca0 = *(undefined8 *)*local_1f0;
        uStack_c98 = *(undefined8 *)((long)auStack_1f90 + lVar86 + 8);
        uStack_c90 = *(undefined8 *)((long)auStack_1f90 + lVar86 + 0x10);
        uStack_c88 = *(undefined8 *)((long)auStack_1f90 + lVar86 + 0x18);
        vpunpcklwd_avx2(*local_1e8,*local_1f0);
        auVar89 = vpunpckhwd_avx2(*local_1e8,*local_1f0);
        local_6e0 = local_ca0;
        uStack_6d8 = uStack_c98;
        uStack_6d0 = uStack_c90;
        uStack_6c8 = uStack_c88;
        local_6c0 = local_c80;
        uStack_6b8 = uStack_c78;
        uStack_6b0 = uStack_c70;
        uStack_6a8 = uStack_c68;
        convolve(in_stack_ffffffffffffcef0,in_stack_ffffffffffffcee8);
        local_2f40 = auVar89._0_8_;
        uStack_2f38 = auVar89._8_8_;
        uStack_2f30 = auVar89._16_8_;
        uStack_2f28 = auVar89._24_8_;
        local_800 = local_2f40;
        uStack_7f8 = uStack_2f38;
        uStack_7f0 = uStack_2f30;
        uStack_7e8 = uStack_2f28;
        local_820 = uVar78;
        uStack_818 = uVar79;
        uStack_810 = uVar80;
        uStack_808 = uVar81;
        auVar30._16_8_ = uVar80;
        auVar30._0_16_ = auVar4;
        auVar30._24_8_ = uVar81;
        local_980 = vpaddd_avx2(auVar89,auVar30);
        local_990 = uVar68;
        uStack_988 = 0;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = uVar68;
        auVar89 = vpsrad_avx2(local_980,auVar24);
        local_2f60 = auVar89._0_8_;
        uStack_2f58 = auVar89._8_8_;
        uStack_2f50 = auVar89._16_8_;
        uStack_2f48 = auVar89._24_8_;
        if (local_1718 - local_2c9c < 5) {
          local_400 = local_2f60;
          uStack_3f8 = uStack_2f58;
          uStack_3f0 = uStack_2f50;
          uStack_3e8 = uStack_2f48;
          local_420 = local_2f60;
          uStack_418 = uStack_2f58;
          uStack_410 = uStack_2f50;
          uStack_408 = uStack_2f48;
          local_30c0 = vpackssdw_avx2(auVar89,auVar89);
          uStack_1508 = uStack_30a8;
          local_1540 = uVar70;
          uStack_1538 = uVar71;
          uStack_1530 = uVar72;
          uStack_1528 = uVar73;
          auVar13._16_8_ = uVar72;
          auVar13._0_16_ = auVar5;
          auVar13._24_8_ = uVar73;
          _local_30e0 = vpaddw_avx2(local_30c0,auVar13);
          local_1520 = wt_00;
          palStack_1518 = res_unsigned_00;
          palStack_1510 = data_ref_0_00;
          if (iVar2 == 0) {
            local_1180 = local_30e0;
            palStack_1178 = palStack_30d8;
            uStack_1170 = uStack_30d0;
            local_e48 = (undefined8 *)
                        (local_1728 + (long)(int)(local_2008 * local_172c + local_2c9c) * 2);
            local_e60 = local_30e0;
            palStack_e58 = palStack_30d8;
            *local_e48 = local_30e0;
            local_e48[1] = palStack_30d8;
            local_e68 = (undefined8 *)
                        (local_1728 +
                        (long)(int)(local_2008 * local_172c + local_2c9c + local_172c) * 2);
            local_e80 = uStack_30d0;
            *local_e68 = uStack_30d0;
            local_e68[1] = uVar90;
            in_stack_ffffffffffffce78 = palStack_30d8;
            uStack_1168 = uVar90;
            uStack_e78 = uVar90;
          }
          else {
            iVar85 = local_2008 * local_172c + local_2c9c;
            auVar89 = _local_30e0;
            load_line2_avx2((__m256i *)(local_1728 + (long)iVar85 * 2),
                            (void *)(local_1728 + (long)(int)(iVar85 + local_172c) * 2),
                            (void *)(ulong)local_172c);
            comp_avg(data_ref_0_00,res_unsigned_00,wt_00,use_dist_wtd_comp_avg_00);
            in_stack_ffffffffffffcee0 = auVar89._0_8_;
            in_stack_ffffffffffffcee8 = auVar89._8_8_;
            in_stack_ffffffffffffcef0 = auVar89._16_8_;
            convolve_rounding(in_stack_ffffffffffffce90,(__m256i *)in_stack_ffffffffffffce88,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffce84,in_stack_ffffffffffffce80),
                              (int)((ulong)in_stack_ffffffffffffce78 >> 0x20));
            local_3140 = auVar89._0_8_;
            in_stack_ffffffffffffcec8 = auVar89._8_8_;
            in_stack_ffffffffffffced0 = auVar89._16_8_;
            in_stack_ffffffffffffced8 = auVar89._24_8_;
            local_12e0 = local_3140;
            local_1300 = local_3140;
            auVar89 = vpackuswb_avx2(auVar89,auVar89);
            local_1160 = auVar89._0_8_;
            uStack_1158 = auVar89._8_8_;
            in_stack_ffffffffffffce90 = auVar89._16_8_;
            uStack_3148 = auVar89._24_8_;
            uStack_1148 = uStack_3148;
            uStack_f18 = uStack_3148;
            local_f20._0_4_ = auVar89._16_4_;
            *(undefined4 *)(local_1710 + (local_2008 * local_1714 + local_2c9c)) = local_f20._0_4_;
            *(undefined4 *)(local_1710 + (local_2008 * local_1714 + local_2c9c + local_1714)) =
                 in_stack_ffffffffffffce80;
            palStack_12f8 = in_stack_ffffffffffffcec8;
            palStack_12f0 = in_stack_ffffffffffffced0;
            uStack_12e8 = in_stack_ffffffffffffced8;
            palStack_12d8 = in_stack_ffffffffffffcec8;
            palStack_12d0 = in_stack_ffffffffffffced0;
            uStack_12c8 = in_stack_ffffffffffffced8;
            palStack_1150 = in_stack_ffffffffffffce90;
            local_f20 = in_stack_ffffffffffffce90;
            local_f10 = in_stack_ffffffffffffce90;
            uStack_f08 = uStack_f18;
          }
        }
        else {
          auVar88 = auVar89;
          convolve(in_stack_ffffffffffffcef0,in_stack_ffffffffffffcee8);
          local_2f80 = auVar88._0_8_;
          uStack_2f78 = auVar88._8_8_;
          uStack_2f70 = auVar88._16_8_;
          uStack_2f68 = auVar88._24_8_;
          local_840 = local_2f80;
          uStack_838 = uStack_2f78;
          uStack_830 = uStack_2f70;
          uStack_828 = uStack_2f68;
          local_860 = uVar78;
          uStack_858 = uVar79;
          uStack_850 = uVar80;
          uStack_848 = uVar81;
          auVar29._16_8_ = uVar80;
          auVar29._0_16_ = auVar4;
          auVar29._24_8_ = uVar81;
          local_9c0 = vpaddd_avx2(auVar88,auVar29);
          local_9d0 = uVar68;
          uStack_9c8 = 0;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = uVar68;
          auVar88 = vpsrad_avx2(local_9c0,auVar23);
          local_2fa0 = auVar88._0_8_;
          uStack_2f98 = auVar88._8_8_;
          uStack_2f90 = auVar88._16_8_;
          uStack_2f88 = auVar88._24_8_;
          local_3c0 = local_2f60;
          uStack_3b8 = uStack_2f58;
          uStack_3b0 = uStack_2f50;
          uStack_3a8 = uStack_2f48;
          local_3e0 = local_2fa0;
          uStack_3d8 = uStack_2f98;
          uStack_3d0 = uStack_2f90;
          uStack_3c8 = uStack_2f88;
          auVar89 = vpackssdw_avx2(auVar89,auVar88);
          local_2fc0 = auVar89._0_8_;
          uStack_2fb8 = auVar89._8_8_;
          uStack_2fb0 = auVar89._16_8_;
          uStack_2fa8 = auVar89._24_8_;
          local_14e0 = local_2fc0;
          uStack_14d8 = uStack_2fb8;
          uStack_14d0 = uStack_2fb0;
          uStack_14c8 = uStack_2fa8;
          local_1500 = uVar70;
          uStack_14f8 = uVar71;
          uStack_14f0 = uVar72;
          uStack_14e8 = uVar73;
          auVar14._16_8_ = uVar72;
          auVar14._0_16_ = auVar5;
          auVar14._24_8_ = uVar73;
          auVar89 = vpaddw_avx2(auVar89,auVar14);
          if (iVar2 == 0) {
            local_2fe0 = auVar89._0_8_;
            uStack_2fd8 = auVar89._8_8_;
            uStack_2fd0 = auVar89._16_8_;
            uStack_2fc8 = auVar89._24_8_;
            local_1140 = local_2fe0;
            uStack_1138 = uStack_2fd8;
            uStack_1130 = uStack_2fd0;
            uStack_1128 = uStack_2fc8;
            local_e08 = (undefined8 *)
                        (local_1728 + (long)(int)(local_2008 * local_172c + local_2c9c) * 2);
            local_e20 = local_2fe0;
            uStack_e18 = uStack_2fd8;
            *local_e08 = local_2fe0;
            local_e08[1] = uStack_2fd8;
            local_e28 = (undefined8 *)
                        (local_1728 +
                        (long)(int)(local_2008 * local_172c + local_2c9c + local_172c) * 2);
            local_e40 = uStack_2fd0;
            uStack_e38 = uStack_2fc8;
            *local_e28 = uStack_2fd0;
            local_e28[1] = uStack_2fc8;
          }
          else {
            iVar85 = local_2008 * local_172c + local_2c9c;
            load_line2_avx2((__m256i *)(local_1728 + (long)iVar85 * 2),
                            (void *)(local_1728 + (long)(int)(iVar85 + local_172c) * 2),
                            (void *)(ulong)local_172c);
            comp_avg(data_ref_0_00,res_unsigned_00,wt_00,use_dist_wtd_comp_avg_00);
            convolve_rounding(in_stack_ffffffffffffce90,(__m256i *)in_stack_ffffffffffffce88,
                              (__m256i *)
                              CONCAT44(in_stack_ffffffffffffce84,in_stack_ffffffffffffce80),
                              (int)((ulong)in_stack_ffffffffffffce78 >> 0x20));
            local_3040 = auVar89._0_8_;
            uStack_3038 = auVar89._8_8_;
            uStack_3030 = auVar89._16_8_;
            uStack_3028 = auVar89._24_8_;
            local_12a0 = local_3040;
            uStack_1298 = uStack_3038;
            uStack_1290 = uStack_3030;
            uStack_1288 = uStack_3028;
            local_12c0 = local_3040;
            uStack_12b8 = uStack_3038;
            uStack_12b0 = uStack_3030;
            uStack_12a8 = uStack_3028;
            auVar89 = vpackuswb_avx2(auVar89,auVar89);
            local_3060 = auVar89._0_8_;
            uStack_3058 = auVar89._8_8_;
            uStack_3050 = auVar89._16_8_;
            uStack_3048 = auVar89._24_8_;
            local_1120 = local_3060;
            uStack_1118 = uStack_3058;
            uStack_1110 = uStack_3050;
            uStack_1108 = uStack_3048;
            uStack_fd8 = uStack_3048;
            local_fe0 = uStack_3050;
            local_fc8 = (undefined8 *)(local_1710 + (local_2008 * local_1714 + local_2c9c));
            *local_fc8 = uStack_3050;
            local_fe8 = (undefined8 *)
                        (local_1710 + (local_2008 * local_1714 + local_2c9c + local_1714));
            *local_fe8 = local_3080;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_2d_avx2(const uint8_t *src, int src_stride,
                                   uint8_t *dst0, int dst_stride0, int w, int h,
                                   const InterpFilterParams *filter_params_x,
                                   const InterpFilterParams *filter_params_y,
                                   const int subpel_x_qn, const int subpel_y_qn,
                                   ConvolveParams *conv_params) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int bd = 8;

  DECLARE_ALIGNED(32, int16_t, im_block[(MAX_SB_SIZE + MAX_FILTER_TAP) * 8]);

  int im_stride = 8;
  int i, is_horiz_4tap = 0, is_vert_4tap = 0;
  const __m256i wt = unpack_weights_avx2(conv_params);
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi16((1 << rounding_shift) >> 1);

  assert(conv_params->round_0 > 0);

  const __m256i round_const_h = _mm256_set1_epi16(
      ((1 << (conv_params->round_0 - 1)) >> 1) + (1 << (bd + FILTER_BITS - 2)));
  const __m128i round_shift_h = _mm_cvtsi32_si128(conv_params->round_0 - 1);

  const __m256i round_const_v = _mm256_set1_epi32(
      ((1 << conv_params->round_1) >> 1) -
      (1 << (bd + 2 * FILTER_BITS - conv_params->round_0 - 1)));
  const __m128i round_shift_v = _mm_cvtsi32_si128(conv_params->round_1);

  __m256i filt[4], coeffs_x[4], coeffs_y[4];

  filt[0] = _mm256_load_si256((__m256i const *)filt_global_avx2);
  filt[1] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32));

  prepare_coeffs_lowbd(filter_params_x, subpel_x_qn, coeffs_x);
  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

  // Condition for checking valid horz_filt taps
  if (!(_mm256_extract_epi32(_mm256_or_si256(coeffs_x[0], coeffs_x[3]), 0)))
    is_horiz_4tap = 1;

  // Condition for checking valid vert_filt taps
  if (!(_mm256_extract_epi32(_mm256_or_si256(coeffs_y[0], coeffs_y[3]), 0)))
    is_vert_4tap = 1;

  if (is_horiz_4tap) {
    int im_h = h + filter_params_y->taps - 1;
    const int fo_vert = filter_params_y->taps / 2 - 1;
    const int fo_horiz = 1;
    const uint8_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;
    for (int j = 0; j < w; j += 8) {
      /* Horizontal filter */
      const uint8_t *src_h = src_ptr + j;
      for (i = 0; i < im_h; i += 2) {
        __m256i data =
            _mm256_castsi128_si256(_mm_loadu_si128((__m128i *)src_h));
        if (i + 1 < im_h)
          data = _mm256_inserti128_si256(
              data, _mm_loadu_si128((__m128i *)(src_h + src_stride)), 1);
        src_h += (src_stride << 1);
        __m256i res = convolve_lowbd_x_4tap(data, coeffs_x + 1, filt);

        res = _mm256_sra_epi16(_mm256_add_epi16(res, round_const_h),
                               round_shift_h);

        _mm256_store_si256((__m256i *)&im_block[i * im_stride], res);
      }
      DIST_WTD_CONVOLVE_VERTICAL_FILTER_8TAP;
    }
  } else if (is_vert_4tap) {
    int im_h = h + 3;
    const int fo_vert = 1;
    const int fo_horiz = filter_params_x->taps / 2 - 1;
    const uint8_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

    filt[2] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 2));
    filt[3] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 3));

    for (int j = 0; j < w; j += 8) {
      /* Horizontal filter */
      const uint8_t *src_h = src_ptr + j;
      DIST_WTD_CONVOLVE_HORIZONTAL_FILTER_8TAP;

      /* Vertical filter */
      __m256i s[6];
      __m256i s0 = _mm256_loadu_si256((__m256i *)(im_block + 0 * im_stride));
      __m256i s1 = _mm256_loadu_si256((__m256i *)(im_block + 1 * im_stride));
      __m256i s2 = _mm256_loadu_si256((__m256i *)(im_block + 2 * im_stride));
      __m256i s3 = _mm256_loadu_si256((__m256i *)(im_block + 3 * im_stride));

      s[0] = _mm256_unpacklo_epi16(s0, s1);
      s[1] = _mm256_unpacklo_epi16(s2, s3);

      s[3] = _mm256_unpackhi_epi16(s0, s1);
      s[4] = _mm256_unpackhi_epi16(s2, s3);

      for (i = 0; i < h; i += 2) {
        const int16_t *data = &im_block[i * im_stride];

        const __m256i s4 =
            _mm256_loadu_si256((__m256i *)(data + 4 * im_stride));
        const __m256i s5 =
            _mm256_loadu_si256((__m256i *)(data + 5 * im_stride));

        s[2] = _mm256_unpacklo_epi16(s4, s5);
        s[5] = _mm256_unpackhi_epi16(s4, s5);

        const __m256i res_a = convolve_4tap(s, coeffs_y + 1);
        const __m256i res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a, round_const_v), round_shift_v);

        if (w - j > 4) {
          const __m256i res_b = convolve_4tap(s + 3, coeffs_y + 1);
          const __m256i res_b_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_b, round_const_v), round_shift_v);
          const __m256i res_16b = _mm256_packs_epi32(res_a_round, res_b_round);
          const __m256i res_unsigned = _mm256_add_epi16(res_16b, offset_const);

          if (do_average) {
            const __m256i data_ref_0 =
                load_line2_avx2(&dst[i * dst_stride + j],
                                &dst[i * dst_stride + j + dst_stride]);
            const __m256i comp_avg_res = comp_avg(&data_ref_0, &res_unsigned,
                                                  &wt, use_dist_wtd_comp_avg);

            const __m256i round_result = convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_8 =
                _mm256_packus_epi16(round_result, round_result);
            const __m128i res_0 = _mm256_castsi256_si128(res_8);
            const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_storel_epi64(
                (__m128i *)((&dst0[i * dst_stride0 + j + dst_stride0])), res_1);
          } else {
            const __m128i res_0 = _mm256_castsi256_si128(res_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);

            const __m128i res_1 = _mm256_extracti128_si256(res_unsigned, 1);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        } else {
          const __m256i res_16b = _mm256_packs_epi32(res_a_round, res_a_round);
          const __m256i res_unsigned = _mm256_add_epi16(res_16b, offset_const);

          if (do_average) {
            const __m256i data_ref_0 =
                load_line2_avx2(&dst[i * dst_stride + j],
                                &dst[i * dst_stride + j + dst_stride]);

            const __m256i comp_avg_res = comp_avg(&data_ref_0, &res_unsigned,
                                                  &wt, use_dist_wtd_comp_avg);

            const __m256i round_result = convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_8 =
                _mm256_packus_epi16(round_result, round_result);
            const __m128i res_0 = _mm256_castsi256_si128(res_8);
            const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

            *(int *)(&dst0[i * dst_stride0 + j]) = _mm_cvtsi128_si32(res_0);
            *(int *)(&dst0[i * dst_stride0 + j + dst_stride0]) =
                _mm_cvtsi128_si32(res_1);

          } else {
            const __m128i res_0 = _mm256_castsi256_si128(res_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);

            const __m128i res_1 = _mm256_extracti128_si256(res_unsigned, 1);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        }
        s[0] = s[1];
        s[1] = s[2];
        s[3] = s[4];
        s[4] = s[5];
      }
    }
  } else {
    int im_h = h + filter_params_y->taps - 1;
    const int fo_vert = filter_params_y->taps / 2 - 1;
    const int fo_horiz = filter_params_x->taps / 2 - 1;
    const uint8_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

    filt[2] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 2));
    filt[3] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 3));

    for (int j = 0; j < w; j += 8) {
      /* Horizontal filter */
      const uint8_t *src_h = src_ptr + j;
      DIST_WTD_CONVOLVE_HORIZONTAL_FILTER_8TAP;

      DIST_WTD_CONVOLVE_VERTICAL_FILTER_8TAP;
    }
  }
}